

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_2,
          uint32_t *out,size_t *nvalue)

{
  int iVar1;
  undefined4 extraout_var;
  NotEnoughStorage *this_00;
  uint32_t uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  bool bVar6;
  size_t out_len;
  uint32_t *puVar2;
  
  uVar3 = *in;
  if ((ulong)(uVar3 << 7) <= *nvalue) {
    puVar2 = in + 1;
    out_len = 0;
    puVar4 = out;
    while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
      iVar1 = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[0xb])(this,puVar2,puVar4,&out_len);
      puVar2 = (uint32_t *)CONCAT44(extraout_var,iVar1);
      puVar4 = puVar4 + out_len;
    }
    uVar5 = (long)puVar4 - (long)out >> 2;
    if (*nvalue < uVar5) {
      fwrite("possible buffer overrun\n",0x18,1,_stderr);
    }
    *nvalue = uVar5;
    return puVar2;
  }
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
  __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;
  size_t out_len = 0;
  for (uint32_t i = 0; i < numBlocks; i++) {
    in = decodeBlock(in, out, out_len);
    out += out_len;
  }

  if (static_cast<size_t>(out - initout) > nvalue) {
    fprintf(stderr, "possible buffer overrun\n");
  }
  ASSERT(in <= len + initin,
      std::to_string(in - initin) + " " + std::to_string(len));

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}